

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.c
# Opt level: O2

void V_Constr(Vector *V,char *Name,size_t Dim,InstanceType Instance,Boolean OwnData)

{
  LASErrIdType LVar1;
  size_t sVar2;
  char *__dest;
  Real *pRVar3;
  
  sVar2 = strlen(Name);
  __dest = (char *)malloc(sVar2 + 1);
  V->Name = __dest;
  if (__dest == (char *)0x0) {
    LASError(LASMemAllocErr,"V_Constr",Name,(char *)0x0,(char *)0x0);
  }
  else {
    strcpy(__dest,Name);
  }
  V->Dim = Dim;
  V->Instance = Instance;
  V->LockLevel = 0;
  V->Multipl = 1.0;
  V->OwnData = OwnData;
  if (OwnData != False) {
    LVar1 = LASResult();
    if (LVar1 == LASOK) {
      pRVar3 = (Real *)malloc(Dim * 8 + 8);
      V->Cmp = pRVar3;
      if (pRVar3 == (Real *)0x0) {
        LASError(LASMemAllocErr,"V_Constr",Name,(char *)0x0,(char *)0x0);
        return;
      }
    }
    else {
      V->Cmp = (Real *)0x0;
    }
  }
  return;
}

Assistant:

void V_Constr(Vector *V, char *Name, size_t Dim, InstanceType Instance,
              Boolean OwnData)
/* constructor of the type Vector */
{
    V->Name = (char *)malloc((strlen(Name) + 1) * sizeof(char));
    if (V->Name != NULL)
        strcpy(V->Name, Name);
    else
        LASError(LASMemAllocErr, "V_Constr", Name, NULL, NULL);
    V->Dim = Dim;
    V->Instance = Instance;
    V->LockLevel = 0;
    V->Multipl = 1.0;
    V->OwnData = OwnData;
    if (OwnData) {
        if (LASResult() == LASOK) {
            V->Cmp = (Real *)malloc((Dim + 1) * sizeof(Real));
            if (V->Cmp == NULL) 
                LASError(LASMemAllocErr, "V_Constr", Name, NULL, NULL);
        } else {
            V->Cmp = NULL;
        }
    }
}